

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::EncryptAes256(ByteData *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  CfdException *this;
  uchar *puVar4;
  size_type sVar5;
  uchar *bytes;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  string *in_stack_fffffffffffffde0;
  string *message;
  size_type in_stack_fffffffffffffde8;
  CfdError CVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CfdException *in_stack_fffffffffffffdf0;
  undefined1 local_161 [33];
  CfdSourceLocation local_140;
  int local_128 [2];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  size_t data_size;
  string local_a8 [32];
  CfdSourceLocation local_88;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  CfdSourceLocation local_38;
  ByteData *local_20;
  ByteData *data_local;
  ByteData *key_local;
  
  local_20 = data;
  data_local = key;
  key_local = __return_storage_ptr__;
  sVar2 = ByteData::GetDataSize(key);
  if (sVar2 != 0x20) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffde8 >> 0x20);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x240;
    local_38.funcname = "EncryptAes256";
    logger::warn<>(&local_38,"wally_aes key size NG.");
    local_6d = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"EncryptAes256Cbc key size error.",&local_59);
    CfdException::CfdException(in_stack_fffffffffffffdf0,CVar6,in_stack_fffffffffffffde0);
    local_6d = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ByteData::IsEmpty(local_20);
  if (!bVar1) {
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)ByteData::GetDataSize(local_20);
    sVar2 = ByteData::GetDataSize(local_20);
    if ((sVar2 & 0xf) != 0) {
      sVar2 = ByteData::GetDataSize(local_20);
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(((sVar2 >> 4) + 1) * 0x10);
    }
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3ee023);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8,(allocator_type *)in_stack_fffffffffffffde0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3ee04b);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,data_local);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_20);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3ee090);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8,(allocator_type *)in_stack_fffffffffffffde0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3ee0b8);
    this = (CfdException *)
           ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ee0cb);
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ee0e5);
    sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    CVar6 = (CfdError)((ulong)this_00 >> 0x20);
    memcpy(this,puVar4,sVar5);
    puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ee121);
    sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ee147);
    bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ee174);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    local_128[0] = wally_aes(puVar4,sVar5,bytes,bytes_len,1,bytes_out,len);
    if (local_128[0] != 0) {
      local_140.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      local_140.filename = local_140.filename + 1;
      local_140.line = 0x25d;
      local_140.funcname = "EncryptAes256";
      logger::warn<int&>(&local_140,"wally_aes NG[{}].",local_128);
      uVar3 = __cxa_allocate_exception(0x30);
      message = (string *)local_161;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_161 + 1),"EncryptAes256 error.",(allocator *)message);
      CfdException::CfdException(this,CVar6,message);
      __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
    return __return_storage_ptr__;
  }
  local_88.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  CVar6 = (CfdError)(in_stack_fffffffffffffde8 >> 0x20);
  local_88.filename = local_88.filename + 1;
  local_88.line = 0x246;
  local_88.funcname = "EncryptAes256";
  logger::warn<>(&local_88,"wally_aes data is Empty.");
  data_size._6_1_ = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_a8,"EncryptAes256Cbc data isEmpty.",(allocator *)((long)&data_size + 7));
  CfdException::CfdException(in_stack_fffffffffffffdf0,CVar6,in_stack_fffffffffffffde0);
  data_size._6_1_ = 0;
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256(const ByteData &key, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size = data.GetDataSize();
  if (data.GetDataSize() % kAesBlockLength != 0) {
    data_size = ((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength;
  }
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> value_data = data.GetBytes();
  std::vector<uint8_t> input(data_size);
  // To fill the end with 0
  memcpy(
      input.data(), reinterpret_cast<const uint8_t *>(value_data.data()),
      value_data.size());

  // Encrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key_data.data(), key_data.size(), input.data(), input.size(),
      AES_FLAG_ENCRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256 error.");
  }

  return ByteData(output);
}